

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIFont.cpp
# Opt level: O1

s32 __thiscall irr::gui::CGUIFont::getCharacterFromPos(CGUIFont *this,wchar_t *text,s32 pixel_x)

{
  int iVar1;
  pointer pSVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong unaff_RBP;
  int iVar6;
  
  pSVar2 = (this->Areas).m_data.
           super__Vector_base<irr::gui::CGUIFont::SFontArea,_std::allocator<irr::gui::CGUIFont::SFontArea>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar1 = this->GlobalKerningWidth;
  uVar5 = 0;
  iVar6 = 0;
  do {
    if (text[uVar5] == L'\0') {
      return -1;
    }
    uVar4 = getAreaFromCharacter(this,text[uVar5]);
    iVar6 = iVar6 + pSVar2[uVar4].width + pSVar2[uVar4].overhang + pSVar2[uVar4].underhang + iVar1;
    uVar3 = unaff_RBP;
    if (pixel_x <= iVar6) {
      uVar3 = uVar5;
    }
    unaff_RBP = uVar3 & 0xffffffff;
    uVar5 = uVar5 + 1;
  } while (iVar6 < pixel_x);
  return (s32)uVar3;
}

Assistant:

s32 CGUIFont::getCharacterFromPos(const wchar_t *text, s32 pixel_x) const
{
	s32 x = 0;
	s32 idx = 0;

	while (text[idx]) {
		const SFontArea &a = Areas[getAreaFromCharacter(text[idx])];

		x += a.width + a.overhang + a.underhang + GlobalKerningWidth;

		if (x >= pixel_x)
			return idx;

		++idx;
	}

	return -1;
}